

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode JsDiagGetBreakpoints(JsValueRef *breakpoints)

{
  ScriptContext *pSVar1;
  JsrtRuntime *this;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  int iVar5;
  JsrtContext *pJVar6;
  JsrtDebugManager *this_00;
  undefined4 *puVar7;
  ScriptContext **ppSVar8;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_80 [8];
  EnterScriptObject __enterScriptObject;
  ThreadContextScope scope;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar6 = JsrtContext::GetCurrent();
  JVar4 = CheckContext(pJVar6,false,false);
  if (JVar4 == JsNoError) {
    pSVar1 = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_b8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_80,pSVar1,(ScriptEntryExitRecord *)auStack_b8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar1,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_80);
    if (breakpoints == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      *breakpoints = (JsValueRef)0x0;
      pJVar6 = JsrtContext::GetCurrent();
      this = (pJVar6->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar4 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        this_00 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar4 = JsErrorDiagNotInDebugMode;
        if (this_00 != (JsrtDebugManager *)0x0) {
          bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
          if (bVar3) {
            scope.originalContext =
                 (ThreadContext *)
                 Js::JavascriptLibrary::CreateArray
                           ((((((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                              scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary);
            ppSVar8 = &this->threadContext->scriptContextList;
            while (pSVar1 = *ppSVar8, pSVar1 != (ScriptContext *)0x0) {
              iVar5 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar1);
              if ((char)iVar5 != '\0') break;
              JsrtDebugManager::GetBreakpoints
                        (this_00,(JavascriptArray **)&scope.originalContext,pSVar1);
              ppSVar8 = &pSVar1->next;
            }
            *breakpoints = scope.originalContext;
            JVar4 = JsNoError;
          }
        }
      }
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_80);
    if ((((JVar4 & 0x6ffff) == JsErrorOutOfMemory) ||
        (((JVar4 - JsErrorNoCurrentContext < 7 &&
          ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)
         ))) || (JVar4 == JsErrorScriptTerminated)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsDiagGetBreakpoints(
    _Out_ JsValueRef *breakpoints)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoints);
        *breakpoints = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::JavascriptArray* bpsArray = currentContext->GetScriptContext()->GetLibrary()->CreateArray();

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            jsrtDebugManager->GetBreakpoints(&bpsArray, currentScriptContext);
        }

        *breakpoints = bpsArray;
        return JsNoError;
    });
#endif
}